

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall json::Object::stringify_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  Type *pTVar4;
  string local_200 [32];
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
  local_1d8;
  iterator local_1d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
  local_1c8;
  iterator local_1c0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
  local_1b8;
  const_iterator field;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  Object *local_18;
  Object *this_local;
  
  local_18 = this;
  this_local = (Object *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"{");
  local_1c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
       ::begin(&this->fields);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
  ::_Rb_tree_const_iterator(&local_1b8,&local_1c0);
  while( true ) {
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
         ::end(&this->fields);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
    ::_Rb_tree_const_iterator(&local_1c8,&local_1d0);
    bVar1 = std::operator!=(&local_1b8,&local_1c8);
    if (!bVar1) break;
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
         ::begin(&this->fields);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
    ::_Rb_tree_const_iterator(&local_1d8,&local_1e0);
    bVar1 = std::operator!=(&local_1b8,&local_1d8);
    if (bVar1) {
      std::operator<<(local_190,", ");
    }
    poVar2 = std::operator<<(local_190,"\"");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
             ::operator->(&local_1b8);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2,"\"");
    poVar2 = std::operator<<(poVar2,": ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
             ::operator->(&local_1b8);
    pTVar4 = common::XPtr<json::Type>::operator->(&ppVar3->second);
    (*pTVar4->_vptr_Type[1])(local_200);
    std::operator<<(poVar2,local_200);
    std::__cxx11::string::~string(local_200);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>
    ::operator++(&local_1b8);
  }
  std::operator<<(local_190,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << "{";
            for_each_c (Fields, fields, field) {
                if (field != fields.begin()) stream << ", ";
                stream << "\"" << field->first << "\"" << ": " << field->second->stringify();
            }
            stream << "}";
            return stream.str();
        }